

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

bool __thiscall wallet::SQLiteDatabase::Verify(SQLiteDatabase *this,bilingual_str *error)

{
  string *this_00;
  uint uVar1;
  sqlite3 *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  optional<int> oVar6;
  CChainParams *pCVar7;
  char *__s;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_type sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint *in_R8;
  long in_FS_OFFSET;
  bool bVar11;
  sqlite3_stmt *stmt;
  int32_t user_ver;
  uint32_t net_magic;
  uint32_t app_id;
  string str_msg;
  undefined1 local_170 [12];
  undefined1 local_164 [4];
  undefined1 local_160 [40];
  char *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = this->m_db;
  if (psVar2 == (sqlite3 *)0x0) {
    __assert_fail("m_db",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0xc0,"bool wallet::SQLiteDatabase::Verify(bilingual_str &)");
  }
  paVar3 = &(((bilingual_str *)local_78)->original).field_2;
  local_78._0_8_ = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"application_id","");
  paVar10 = &(((bilingual_str *)local_b8)->original).field_2;
  local_b8._0_8_ = paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_d8 + 0x20),"the application id","");
  oVar6 = ReadPragmaInteger(psVar2,(string *)local_78,(string *)(local_d8 + 0x20),error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ != paVar10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != paVar3) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    local_160._4_4_ =
         oVar6.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
    pCVar7 = Params();
    uVar1 = *(uint *)(pCVar7->pchMessageStart)._M_elems;
    local_160._0_4_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (local_160._4_4_ == local_160._0_4_) {
      psVar2 = this->m_db;
      local_78._0_8_ = paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"user_version","");
      local_b8._0_8_ = paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_d8 + 0x20),"sqlite wallet schema version","");
      oVar6 = ReadPragmaInteger(psVar2,(string *)local_78,(string *)(local_d8 + 0x20),error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != paVar10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &(((bilingual_str *)local_78)->original).field_2) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) goto LAB_0055b586;
      local_164 = oVar6.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_payload;
      if (local_164 == (undefined1  [4])0x0) {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
        local_170._0_8_ = (pointer)0x0;
        iVar5 = sqlite3_prepare_v2(this->m_db,"PRAGMA integrity_check",0xffffffff,args,0);
        if (iVar5 == 0) {
          paVar3 = &(((bilingual_str *)local_78)->translated).field_2;
          this_00 = &error->translated;
          do {
            iVar5 = sqlite3_step(local_170._0_8_);
            if (iVar5 != 100) {
              if (iVar5 != 0x65) {
                _((bilingual_str *)(local_d8 + 0x20),(ConstevalStringLiteral)0x84864a);
                local_d8._0_8_ = sqlite3_errstr(iVar5);
                tinyformat::format<char_const*>
                          ((bilingual_str *)local_78,(tinyformat *)(local_d8 + 0x20),
                           (bilingual_str *)local_d8,(char **)args);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&error->original,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(this_00,&((bilingual_str *)local_78)->translated);
                bilingual_str::~bilingual_str((bilingual_str *)local_78);
                bilingual_str::~bilingual_str((bilingual_str *)(local_d8 + 0x20));
              }
              break;
            }
            __s = (char *)sqlite3_column_text(local_170._0_8_,0);
            if (__s == (char *)0x0) {
              local_b8._0_8_ = &(((bilingual_str *)local_b8)->original).field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_d8 + 0x20),
                         "SQLiteDatabase: Failed to read database verification error: %s","");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_98._M_dataplus._M_p =
                     (pointer)&(((bilingual_str *)local_b8)->translated).field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&((bilingual_str *)local_b8)->translated,
                           "SQLiteDatabase: Failed to read database verification error: %s","");
              }
              else {
                local_d8._0_8_ = "SQLiteDatabase: Failed to read database verification error: %s";
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&((bilingual_str *)local_b8)->translated,
                           (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_d8);
              }
              local_d8._0_8_ = sqlite3_errstr(100);
              tinyformat::format<char_const*>
                        ((bilingual_str *)local_78,(tinyformat *)(local_d8 + 0x20),
                         (bilingual_str *)local_d8,(char **)args);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->original,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(this_00,&((bilingual_str *)local_78)->translated);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != paVar3) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._0_8_ != &(((bilingual_str *)local_78)->original).field_2) {
                operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &(((bilingual_str *)local_b8)->translated).field_2
                 ) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              sVar9 = local_b8._16_8_;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._0_8_ != &(((bilingual_str *)local_b8)->original).field_2)
              goto LAB_0055b760;
            }
            else {
              local_d8._0_8_ = local_d8 + 0x10;
              sVar8 = strlen(__s);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,__s,__s + sVar8);
              iVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d8,"ok");
              if (iVar5 != 0) {
                if ((error->original)._M_string_length == 0) {
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_118,"Failed to verify database","");
                  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager ==
                      (_Manager_type)0x0) {
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f8,"Failed to verify database","");
                  }
                  else {
                    local_b8._0_8_ = "Failed to verify database";
                    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                              (&local_f8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                               (char **)(local_d8 + 0x20));
                  }
                  local_138 = local_130._M_local_buf + 8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"\n","");
                  local_b8._0_8_ = &(((bilingual_str *)local_b8)->original).field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)(local_d8 + 0x20),local_138,
                             local_138 + local_130._M_allocated_capacity);
                  local_98._M_dataplus._M_p =
                       (pointer)&(((bilingual_str *)local_b8)->translated).field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&((bilingual_str *)local_b8)->translated,local_138,
                             local_138 + local_130._M_allocated_capacity);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_118,(char *)local_b8._0_8_,local_b8._8_8_);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_f8,local_98._M_dataplus._M_p,local_98._M_string_length);
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118._M_string_length;
                  local_78._0_8_ = &(((bilingual_str *)local_78)->original).field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p == &local_118.field_2) {
                    local_78._24_8_ = local_118.field_2._8_8_;
                  }
                  else {
                    local_78._0_8_ = local_118._M_dataplus._M_p;
                  }
                  local_78._17_7_ = local_118.field_2._M_allocated_capacity._1_7_;
                  local_78[0x10] = local_118.field_2._M_local_buf[0];
                  local_78._8_8_ = local_118._M_string_length;
                  local_118._M_string_length = 0;
                  local_118.field_2._M_local_buf[0] = '\0';
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
                    local_58.field_2._8_8_ = local_f8.field_2._8_8_;
                    local_58._M_dataplus._M_p = (pointer)paVar3;
                  }
                  else {
                    local_58._M_dataplus._M_p = local_f8._M_dataplus._M_p;
                  }
                  local_58.field_2._M_allocated_capacity._1_7_ =
                       local_f8.field_2._M_allocated_capacity._1_7_;
                  local_58.field_2._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
                  local_58._M_string_length = local_f8._M_string_length;
                  local_f8._M_string_length = 0;
                  local_f8.field_2._M_local_buf[0] = '\0';
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&error->original,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(this_00,&((bilingual_str *)local_78)->translated);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != paVar3) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._0_8_ != &(((bilingual_str *)local_78)->original).field_2) {
                    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p !=
                      &(((bilingual_str *)local_b8)->translated).field_2) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    local_98.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._0_8_ != &(((bilingual_str *)local_b8)->original).field_2) {
                    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
                  }
                  if (local_138 != local_130._M_local_buf + 8) {
                    operator_delete(local_138,local_130._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                    operator_delete(local_f8._M_dataplus._M_p,
                                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                             local_f8.field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p,
                                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                             local_118.field_2._M_local_buf[0]) + 1);
                  }
                }
                tinyformat::format<std::__cxx11::string>
                          ((string *)(local_160 + 8),(tinyformat *)0x8815f5,(char *)local_d8,args);
                local_78._0_8_ = &(((bilingual_str *)local_78)->original).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_78,local_160._8_8_,
                           (undefined1 *)(local_160._16_8_ + local_160._8_8_));
                local_58._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&((bilingual_str *)local_78)->translated,local_160._8_8_,
                           (undefined1 *)(local_160._16_8_ + local_160._8_8_));
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&error->original,(char *)local_78._0_8_,local_78._8_8_);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(this_00,local_58._M_dataplus._M_p,local_58._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != paVar3) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._0_8_ != &(((bilingual_str *)local_78)->original).field_2) {
                  operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
                }
                if ((undefined1 *)local_160._8_8_ != local_160 + 0x18) {
                  operator_delete((void *)local_160._8_8_,local_160._24_8_ + 1);
                }
              }
              sVar9 = local_d8._16_8_;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._0_8_;
              if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
LAB_0055b760:
                operator_delete(paVar10,sVar9 + 1);
              }
            }
          } while (__s != (char *)0x0);
          sqlite3_finalize(local_170._0_8_);
          bVar11 = (error->original)._M_string_length == 0;
          goto LAB_0055bc2b;
        }
        sqlite3_finalize(local_170._0_8_);
        local_b8._0_8_ = paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_d8 + 0x20),
                   "SQLiteDatabase: Failed to prepare statement to verify database: %s","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_98._M_dataplus._M_p = (pointer)&(((bilingual_str *)local_b8)->translated).field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&((bilingual_str *)local_b8)->translated,
                     "SQLiteDatabase: Failed to prepare statement to verify database: %s","");
        }
        else {
          local_d8._0_8_ = "SQLiteDatabase: Failed to prepare statement to verify database: %s";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&((bilingual_str *)local_b8)->translated,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_d8);
        }
        local_d8._0_8_ = sqlite3_errstr(iVar5);
        tinyformat::format<char_const*>
                  ((bilingual_str *)local_78,(tinyformat *)(local_d8 + 0x20),
                   (bilingual_str *)local_d8,(char **)args);
      }
      else {
        local_b8._0_8_ = paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_d8 + 0x20),
                   "SQLiteDatabase: Unknown sqlite wallet schema version %d. Only version %d is supported"
                   ,"");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_98._M_dataplus._M_p = (pointer)&(((bilingual_str *)local_b8)->translated).field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&((bilingual_str *)local_b8)->translated,
                     "SQLiteDatabase: Unknown sqlite wallet schema version %d. Only version %d is supported"
                     ,"");
        }
        else {
          local_d8._0_8_ =
               "SQLiteDatabase: Unknown sqlite wallet schema version %d. Only version %d is supported"
          ;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&((bilingual_str *)local_b8)->translated,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_d8);
        }
        tinyformat::format<int,int>
                  ((bilingual_str *)local_78,(tinyformat *)(local_d8 + 0x20),
                   (bilingual_str *)local_164,&WALLET_SCHEMA_VERSION,(int *)in_R8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&((bilingual_str *)local_78)->translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &(((bilingual_str *)local_78)->translated).field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &(((bilingual_str *)local_78)->original).field_2) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &(((bilingual_str *)local_b8)->translated).field_2)
      goto LAB_0055bd4e;
    }
    else {
      local_b8._0_8_ = paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_d8 + 0x20),
                 "SQLiteDatabase: Unexpected application id. Expected %u, got %u","");
      paVar4 = &(((bilingual_str *)local_b8)->translated).field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_98._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&((bilingual_str *)local_b8)->translated,
                   "SQLiteDatabase: Unexpected application id. Expected %u, got %u","");
      }
      else {
        local_d8._0_8_ = "SQLiteDatabase: Unexpected application id. Expected %u, got %u";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&((bilingual_str *)local_b8)->translated,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_d8);
      }
      tinyformat::format<unsigned_int,unsigned_int>
                ((bilingual_str *)local_78,(tinyformat *)(local_d8 + 0x20),
                 (bilingual_str *)local_160,(uint *)(local_160 + 4),in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&((bilingual_str *)local_78)->translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &(((bilingual_str *)local_78)->translated).field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != paVar3) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar4) {
LAB_0055bd4e:
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != paVar10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
LAB_0055b586:
  bVar11 = false;
LAB_0055bc2b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool SQLiteDatabase::Verify(bilingual_str& error)
{
    assert(m_db);

    // Check the application ID matches our network magic
    auto read_result = ReadPragmaInteger(m_db, "application_id", "the application id", error);
    if (!read_result.has_value()) return false;
    uint32_t app_id = static_cast<uint32_t>(read_result.value());
    uint32_t net_magic = ReadBE32(Params().MessageStart().data());
    if (app_id != net_magic) {
        error = strprintf(_("SQLiteDatabase: Unexpected application id. Expected %u, got %u"), net_magic, app_id);
        return false;
    }

    // Check our schema version
    read_result = ReadPragmaInteger(m_db, "user_version", "sqlite wallet schema version", error);
    if (!read_result.has_value()) return false;
    int32_t user_ver = read_result.value();
    if (user_ver != WALLET_SCHEMA_VERSION) {
        error = strprintf(_("SQLiteDatabase: Unknown sqlite wallet schema version %d. Only version %d is supported"), user_ver, WALLET_SCHEMA_VERSION);
        return false;
    }

    sqlite3_stmt* stmt{nullptr};
    int ret = sqlite3_prepare_v2(m_db, "PRAGMA integrity_check", -1, &stmt, nullptr);
    if (ret != SQLITE_OK) {
        sqlite3_finalize(stmt);
        error = strprintf(_("SQLiteDatabase: Failed to prepare statement to verify database: %s"), sqlite3_errstr(ret));
        return false;
    }
    while (true) {
        ret = sqlite3_step(stmt);
        if (ret == SQLITE_DONE) {
            break;
        }
        if (ret != SQLITE_ROW) {
            error = strprintf(_("SQLiteDatabase: Failed to execute statement to verify database: %s"), sqlite3_errstr(ret));
            break;
        }
        const char* msg = (const char*)sqlite3_column_text(stmt, 0);
        if (!msg) {
            error = strprintf(_("SQLiteDatabase: Failed to read database verification error: %s"), sqlite3_errstr(ret));
            break;
        }
        std::string str_msg(msg);
        if (str_msg == "ok") {
            continue;
        }
        if (error.empty()) {
            error = _("Failed to verify database") + Untranslated("\n");
        }
        error += Untranslated(strprintf("%s\n", str_msg));
    }
    sqlite3_finalize(stmt);
    return error.empty();
}